

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_test.cc
# Opt level: O2

void re2::SetPrefix(void)

{
  bool bVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> v;
  LogMessageFatal local_1e0;
  Set s;
  
  RE2::Options::Options((Options *)&local_1e0,DefaultOptions);
  RE2::Set::Set(&s,(Options *)&local_1e0,ANCHOR_BOTH);
  local_1e0.super_LogMessage._0_8_ = "/prefix/\\d*";
  local_1e0.super_LogMessage._8_4_ = 0xb;
  iVar2 = RE2::Set::Add(&s,(StringPiece *)&local_1e0,(string *)0x0);
  if (iVar2 != 0) {
    LogMessageFatal::LogMessageFatal
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x9c);
    std::operator<<((ostream *)&local_1e0.super_LogMessage.str_,
                    "Check failed: (s.Add(\"/prefix/\\\\d*\", __null)) == (0)");
    LogMessageFatal::~LogMessageFatal(&local_1e0);
  }
  bVar1 = RE2::Set::Compile(&s);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x9d);
    std::operator<<((ostream *)&local_1e0.super_LogMessage.str_,
                    "Check failed: (s.Compile()) == (true)");
    LogMessageFatal::~LogMessageFatal(&local_1e0);
  }
  local_1e0.super_LogMessage._0_8_ = "/prefix";
  local_1e0.super_LogMessage._8_4_ = 7;
  bVar1 = RE2::Set::Match(&s,(StringPiece *)&local_1e0,(vector<int,_std::allocator<int>_> *)0x0);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x9f);
    std::operator<<((ostream *)&local_1e0.super_LogMessage.str_,
                    "Check failed: (s.Match(\"/prefix\", __null)) == (false)");
    LogMessageFatal::~LogMessageFatal(&local_1e0);
  }
  local_1e0.super_LogMessage._0_8_ = "/prefix/";
  local_1e0.super_LogMessage._8_4_ = 8;
  bVar1 = RE2::Set::Match(&s,(StringPiece *)&local_1e0,(vector<int,_std::allocator<int>_> *)0x0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0xa0);
    std::operator<<((ostream *)&local_1e0.super_LogMessage.str_,
                    "Check failed: (s.Match(\"/prefix/\", __null)) == (true)");
    LogMessageFatal::~LogMessageFatal(&local_1e0);
  }
  local_1e0.super_LogMessage._0_8_ = "/prefix/42";
  local_1e0.super_LogMessage._8_4_ = 10;
  bVar1 = RE2::Set::Match(&s,(StringPiece *)&local_1e0,(vector<int,_std::allocator<int>_> *)0x0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0xa1);
    std::operator<<((ostream *)&local_1e0.super_LogMessage.str_,
                    "Check failed: (s.Match(\"/prefix/42\", __null)) == (true)");
    LogMessageFatal::~LogMessageFatal(&local_1e0);
  }
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_1e0.super_LogMessage._0_8_ = "/prefix";
  local_1e0.super_LogMessage._8_4_ = 7;
  bVar1 = RE2::Set::Match(&s,(StringPiece *)&local_1e0,&v);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0xa4);
    std::operator<<((ostream *)&local_1e0.super_LogMessage.str_,
                    "Check failed: (s.Match(\"/prefix\", &v)) == (false)");
    LogMessageFatal::~LogMessageFatal(&local_1e0);
  }
  if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
      v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start) {
    LogMessageFatal::LogMessageFatal
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0xa5);
    std::operator<<((ostream *)&local_1e0.super_LogMessage.str_,"Check failed: (v.size()) == (0)");
    LogMessageFatal::~LogMessageFatal(&local_1e0);
  }
  local_1e0.super_LogMessage._0_8_ = "/prefix/";
  local_1e0.super_LogMessage._8_4_ = 8;
  bVar1 = RE2::Set::Match(&s,(StringPiece *)&local_1e0,&v);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0xa7);
    std::operator<<((ostream *)&local_1e0.super_LogMessage.str_,
                    "Check failed: (s.Match(\"/prefix/\", &v)) == (true)");
    LogMessageFatal::~LogMessageFatal(&local_1e0);
  }
  if ((long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != 4) {
    LogMessageFatal::LogMessageFatal
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0xa8);
    std::operator<<((ostream *)&local_1e0.super_LogMessage.str_,"Check failed: (v.size()) == (1)");
    LogMessageFatal::~LogMessageFatal(&local_1e0);
  }
  if (*v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start != 0
     ) {
    LogMessageFatal::LogMessageFatal
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0xa9);
    std::operator<<((ostream *)&local_1e0.super_LogMessage.str_,"Check failed: (v[0]) == (0)");
    LogMessageFatal::~LogMessageFatal(&local_1e0);
  }
  local_1e0.super_LogMessage._0_8_ = "/prefix/42";
  local_1e0.super_LogMessage._8_4_ = 10;
  bVar1 = RE2::Set::Match(&s,(StringPiece *)&local_1e0,&v);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0xab);
    std::operator<<((ostream *)&local_1e0.super_LogMessage.str_,
                    "Check failed: (s.Match(\"/prefix/42\", &v)) == (true)");
    LogMessageFatal::~LogMessageFatal(&local_1e0);
  }
  if ((long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != 4) {
    LogMessageFatal::LogMessageFatal
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0xac);
    std::operator<<((ostream *)&local_1e0.super_LogMessage.str_,"Check failed: (v.size()) == (1)");
    LogMessageFatal::~LogMessageFatal(&local_1e0);
  }
  if (*v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start != 0
     ) {
    LogMessageFatal::LogMessageFatal
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0xad);
    std::operator<<((ostream *)&local_1e0.super_LogMessage.str_,"Check failed: (v[0]) == (0)");
    LogMessageFatal::~LogMessageFatal(&local_1e0);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v.super__Vector_base<int,_std::allocator<int>_>);
  RE2::Set::~Set(&s);
  return;
}

Assistant:

TEST(Set, Prefix) {
  RE2::Set s(RE2::DefaultOptions, RE2::ANCHOR_BOTH);

  CHECK_EQ(s.Add("/prefix/\\d*", NULL), 0);
  CHECK_EQ(s.Compile(), true);

  CHECK_EQ(s.Match("/prefix", NULL), false);
  CHECK_EQ(s.Match("/prefix/", NULL), true);
  CHECK_EQ(s.Match("/prefix/42", NULL), true);

  vector<int> v;
  CHECK_EQ(s.Match("/prefix", &v), false);
  CHECK_EQ(v.size(), 0);

  CHECK_EQ(s.Match("/prefix/", &v), true);
  CHECK_EQ(v.size(), 1);
  CHECK_EQ(v[0], 0);

  CHECK_EQ(s.Match("/prefix/42", &v), true);
  CHECK_EQ(v.size(), 1);
  CHECK_EQ(v[0], 0);
}